

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

iterator __thiscall
estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
          (vector_s<unsigned_int,12ul> *this,const_iterator pos,uint *first,uint *last)

{
  ulong uVar1;
  long lVar2;
  range_error *this_00;
  size_type n;
  code *pcVar3;
  undefined *puVar4;
  
  n = (long)last - (long)first >> 2;
  if ((long)n < 0) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              ((out_of_range *)this_00,
               "cas::vector_s range constructing/assigning from inverted range.");
    puVar4 = &std::out_of_range::typeinfo;
    pcVar3 = std::out_of_range::~out_of_range;
  }
  else {
    uVar1 = *(long *)this + n;
    if (uVar1 < 0xd) {
      shift_right<unsigned_int*>(this,pos,(uint *)(*(long *)this * 4 + *(long *)(this + 0x38)),n);
      for (lVar2 = 0; (uint *)((long)first + lVar2) != last; lVar2 = lVar2 + 4) {
        *(uint *)((long)pos + lVar2) = *(uint *)((long)first + lVar2);
      }
      *(ulong *)this = uVar1;
      return pos;
    }
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s inserting beyond capacity.");
    puVar4 = &std::range_error::typeinfo;
    pcVar3 = std::range_error::~range_error;
  }
  __cxa_throw(this_00,puVar4,pcVar3);
}

Assistant:

iterator insert (const_iterator pos, InputIt first, InputIt last)
    {
        const std::int64_t count_signed = last - first;
        if (count_signed < 0) {
            ESTL_THROW (std::out_of_range, "cas::vector_s range constructing/assigning from inverted range.");
            return end();
        }
        const size_type count = static_cast<size_type>(count_signed);
        const size_type new_size = size() + count;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s inserting beyond capacity.");
            return end();
        }

        const iterator ipos_start = const_cast<iterator>(pos);
        iterator ipos = ipos_start;
        shift_right(ipos, end(), count);
        for (InputIt it = first; it != last; ++it, ++ipos) {
            const pointer insert_ptr = static_cast<pointer>(ipos);
            new (insert_ptr) value_type(*it);
            // *ipos = *it; // TODO: This seems ok too since the extra elements are already "allocated" by shift_right
        }
        size_ = new_size;
        return ipos_start;
    }